

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_precall(lua_State *L,StkId func,int nresults,int op_call)

{
  Instruction **ppIVar1;
  byte bVar2;
  byte bVar3;
  GCObject *pGVar4;
  Proto *p;
  lua_CFunction p_Var5;
  int *piVar6;
  Instruction *pIVar7;
  CallInfo *pCVar8;
  char cVar9;
  short sVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  TValue *pTVar15;
  CallInfo *pCVar16;
  lua_State *plVar17;
  StkId pTVar18;
  StkId pTVar19;
  uint uVar20;
  ulong uVar21;
  char *pcVar22;
  long lVar23;
  TValue *io1;
  lua_Number __x;
  undefined1 auVar24 [16];
  undefined1 in_ZMM1 [64];
  ravi_compile_options_t local_38;
  
  uVar12 = (uint)func->tt_;
  plVar17 = L;
  do {
    auVar24 = in_ZMM1._0_16_;
    uVar20 = (uVar12 & 0x7f) - 6;
    sVar10 = (short)uVar12;
    switch(uVar20 >> 4 | uVar20 * 0x10000000) {
    case 0:
      if (sVar10 != -0x7ffa) {
        pcVar22 = "((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_001154ac:
        __assert_fail(pcVar22,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1cd,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      if ((func->value_).f[8] != (_func_int_lua_State_ptr)0x6) {
        pcVar22 = "(((func)->value_).gc)->tt == ((6) | ((0) << 4))";
        goto LAB_001154ac;
      }
      p = *(Proto **)((func->value_).f + 0x18);
      bVar2 = p->maxstacksize;
      uVar21 = (long)L->top - (long)func;
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)bVar2) {
        pTVar19 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,(uint)bVar2);
        func = (StkId)(((long)func - (long)pTVar19) + (long)L->stack);
      }
      bVar3 = p->numparams;
      uVar12 = (uint)bVar3;
      iVar13 = (int)(uVar21 >> 4);
      if (p->is_vararg == '\0') {
        if (iVar13 <= (int)uVar12) {
          pTVar19 = L->top;
          iVar13 = (uVar12 - iVar13) + 1;
          do {
            pTVar19->tt_ = 0;
            pTVar19 = pTVar19 + 1;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          L->top = pTVar19;
        }
        pTVar19 = func + 1;
      }
      else {
        pTVar19 = L->top;
        uVar20 = 0;
        if ((1 < iVar13) && (bVar3 != 0)) {
          iVar14 = iVar13 + -1;
          uVar20 = iVar13 - 2U;
          if (bVar3 - 1 <= iVar13 - 2U) {
            uVar20 = bVar3 - 1;
          }
          uVar20 = uVar20 + 1;
          lVar23 = 0;
          do {
            pTVar18 = L->top;
            L->top = pTVar18 + 1;
            pGVar4 = *(GCObject **)((long)&pTVar19[-(long)iVar14].value_ + lVar23);
            (pTVar18->value_).gc = pGVar4;
            uVar11 = *(ushort *)((long)&pTVar19[-(long)iVar14].tt_ + lVar23);
            pTVar18->tt_ = uVar11;
            if (((short)uVar11 < 0) &&
               (((uVar11 & 0x7f) != (ushort)pGVar4->tt ||
                ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x13d,"StkId adjust_varargs(lua_State *, Proto *, int)");
            }
            *(undefined2 *)((long)&pTVar19[-(long)iVar14].tt_ + lVar23) = 0;
            lVar23 = lVar23 + 0x10;
          } while ((ulong)uVar20 << 4 != lVar23);
        }
        iVar13 = uVar12 - uVar20;
        if (uVar20 <= uVar12 && iVar13 != 0) {
          pTVar18 = L->top;
          do {
            pTVar18->tt_ = 0;
            pTVar18 = pTVar18 + 1;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          L->top = pTVar18;
        }
      }
      pCVar16 = L->ci->next;
      if (pCVar16 == (CallInfo *)0x0) {
        pCVar16 = luaE_extendCI(L);
      }
      L->ci = pCVar16;
      pTVar18 = pTVar19 + bVar2;
      pCVar16->nresults = (short)nresults;
      pCVar16->func = func;
      (pCVar16->u).l.base = pTVar19;
      pCVar16->top = pTVar18;
      L->top = pTVar18;
      if (L->stack_last < pTVar18) {
        __assert_fail("ci->top <= L->stack_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1dd,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      pIVar7 = p->code;
      (pCVar16->u).l.savedpc = pIVar7;
      pCVar16->callstatus = 2;
      pCVar16->jitstatus = '\0';
      if ((L->hookmask & 1) != 0) {
        (pCVar16->u).l.savedpc = pIVar7 + 1;
        pCVar8 = pCVar16->previous;
        iVar13 = 0;
        if ((((pCVar8->callstatus & 2) != 0) && (iVar13 = 0, pCVar8->jitstatus == '\0')) &&
           (iVar13 = 0, *(char *)((pCVar8->u).c.old_errfunc + -4) == '%')) {
          iVar13 = 4;
          pCVar16->callstatus = 0x22;
        }
        luaD_hook(L,iVar13,-1);
        ppIVar1 = &(pCVar16->u).l.savedpc;
        *ppIVar1 = *ppIVar1 + -1;
      }
      plVar17 = L->l_G->mainthread;
      if (plVar17 == L) {
        if ((p->ravi_jit).jit_status == '\0') {
          local_38 = (ravi_compile_options_t)0x0;
          raviV_compile(L,p,&local_38);
          plVar17 = L->l_G->mainthread;
          goto LAB_0011526b;
        }
      }
      else {
LAB_0011526b:
        if (plVar17 != L) {
          return 0;
        }
      }
      if ((p->ravi_jit).jit_function == (lua_CFunction)0x0) {
        return 0;
      }
      pCVar16->jitstatus = '\x01';
      ppIVar1 = &(pCVar16->u).l.savedpc;
      *ppIVar1 = *ppIVar1 + 1;
      uVar11 = L->nCcalls + 1;
      L->nCcalls = uVar11;
      if (0x7c < uVar11) {
        if (uVar11 == 0x7d) {
          pcVar22 = "stack overflow";
LAB_001153cf:
          luaG_runerror(L,pcVar22);
        }
        if (0x8b < uVar11) {
          luaD_throw(L,6);
        }
      }
      L->nny = L->nny + 1;
      iVar13 = (*(p->ravi_jit).jit_function)(L);
      uVar12._0_2_ = L->nny;
      uVar12._2_2_ = L->nCcalls;
      auVar24 = vpcmpeqd_avx(auVar24,auVar24);
      auVar24 = vpaddw_avx(ZEXT416(uVar12),auVar24);
      L->nny = (short)auVar24._0_4_;
      L->nCcalls = (short)((uint)auVar24._0_4_ >> 0x10);
      if (op_call == 0) {
        return 2;
      }
      if (iVar13 != 0) {
        if ((L->ci->callstatus & 2) == 0) {
          __assert_fail("((L->ci)->callstatus & (1<<1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x205,"int luaD_precall(lua_State *, StkId, int, int)");
        }
        L->top = L->ci->top;
        return 2;
      }
      return 2;
    case 1:
      pTVar19 = func;
      if (sVar10 != 0x16) {
        __assert_fail("((((func))->tt_) == (((6) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1b7,"int luaD_precall(lua_State *, StkId, int, int)");
      }
LAB_0011502d:
      p_Var5 = (pTVar19->value_).f;
      if ((long)L->stack_last - (long)L->top < 0x150) {
        pTVar19 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,0x14);
        func = (StkId)(((long)func - (long)pTVar19) + (long)L->stack);
      }
      pCVar16 = L->ci->next;
      if (pCVar16 == (CallInfo *)0x0) {
        pCVar16 = luaE_extendCI(L);
      }
      L->ci = pCVar16;
      pCVar16->nresults = (short)nresults;
      pCVar16->func = func;
      pTVar19 = L->top;
      pCVar16->top = pTVar19 + 0x14;
      if (L->stack_last < pTVar19 + 0x14) {
        __assert_fail("ci->top <= L->stack_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1bf,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      pCVar16->callstatus = 0;
      pCVar16->jitstatus = '\0';
      if ((L->hookmask & 1) != 0) {
        luaD_hook(L,0,-1);
      }
      piVar6 = *(int **)&L[-1].hookmask;
      *piVar6 = *piVar6 + -1;
      if (*piVar6 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c4,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      iVar14 = (*p_Var5)(L);
      iVar13 = **(int **)&L[-1].hookmask;
      **(int **)&L[-1].hookmask = iVar13 + 1;
      if (iVar13 != 0) {
        __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c6,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      if ((long)iVar14 < (long)L->top - (long)L->ci->func >> 4) {
        luaD_poscall(L,pCVar16,L->top + -(long)iVar14,iVar14);
        return 1;
      }
      __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1c7,"int luaD_precall(lua_State *, StkId, int, int)");
    case 2:
      if (sVar10 == -0x7fda) {
        if ((func->value_).f[8] == (_func_int_lua_State_ptr)0x26) {
          pTVar19 = (StkId)((func->value_).f + 0x18);
          goto LAB_0011502d;
        }
        pcVar22 = "(((func)->value_).gc)->tt == ((6) | ((2) << 4))";
      }
      else {
        pcVar22 = "((((func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
      }
      __assert_fail(pcVar22,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1b4,"int luaD_precall(lua_State *, StkId, int, int)");
    default:
      if ((long)L->stack_last - (long)L->top < 0x11) {
        pTVar19 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,1);
        func = (StkId)(((long)func - (long)pTVar19) + (long)L->stack);
      }
      plVar17 = L;
      pTVar15 = luaT_gettmbyobj(L,func,TM_CALL);
      if ((pTVar15->tt_ & 0xf) != 6) {
        luaG_typeerror(L,func,"call");
      }
      pTVar19 = L->top;
      if (func < pTVar19) {
        do {
          pGVar4 = pTVar19[-1].value_.gc;
          (pTVar19->value_).gc = pGVar4;
          uVar11 = pTVar19[-1].tt_;
          pTVar19->tt_ = uVar11;
          if (((short)uVar11 < 0) &&
             ((plVar17 = (lua_State *)(ulong)pGVar4->tt, (uVar11 & 0x7f) != (ushort)pGVar4->tt ||
              ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x152,"void tryfuncTM(lua_State *, StkId)");
          }
          pTVar19 = pTVar19 + -1;
        } while (func < pTVar19);
        pTVar19 = L->top;
      }
      L->top = pTVar19 + 1;
      pGVar4 = (pTVar15->value_).gc;
      (func->value_).gc = pGVar4;
      uVar11 = pTVar15->tt_;
      uVar12 = (uint)uVar11;
      func->tt_ = uVar11;
      if (((short)uVar11 < 0) &&
         (((uVar11 & 0x7f) != (ushort)pGVar4->tt ||
          ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x154,"void tryfuncTM(lua_State *, StkId)");
      }
      break;
    case 4:
      cVar9 = (char)(uVar12 >> 8);
      if (((byte)(cVar9 - 1U) < 3) && (((long)L->top - (long)func & 0xffffffff0U) == 0x20)) {
        pTVar19 = func + 1;
        if (func[1].tt_ == 0x13) {
          __x = (lua_Number)(pTVar19->value_).i;
LAB_00115179:
          if (cVar9 == '\x02') {
            __x = log(__x);
          }
          else if (uVar12 >> 8 == 1) {
            __x = exp(__x);
          }
          else {
            if ((short)(uVar12 & 0x7f) != 0x46) {
              __assert_fail("((((func)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x229,"int luaD_precall(lua_State *, StkId, int, int)");
            }
            (*(func->value_).f)(plVar17);
          }
          (func->value_).n = __x;
          func->tt_ = 3;
          L->top = pTVar19;
          return 1;
        }
        if (func[1].tt_ == 3) {
          __x = (pTVar19->value_).n;
          goto LAB_00115179;
        }
      }
      pcVar22 = "Unsupported fastcall to C function";
      goto LAB_001153cf;
    }
  } while( true );
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults, int op_call) {
  lua_CFunction f;
  CallInfo *ci;
  switch (ttype(func)) {
    case LUA_TCCL:  /* C closure */
      f = clCvalue(func)->f;
      goto Cfunc;
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
     Cfunc: {
      int n;  /* number of returns */
      checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, ci, L->top - n, n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      int n = cast_int(L->top - func) - 1;  /* number of real arguments */
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      if (p->is_vararg)
        base = adjust_varargs(L, p, n);
      else {  /* non vararg function */
        for (; n < p->numparams; n++)
          setnilvalue(L->top++);  /* complete missing arguments */
        base = func + 1;
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      L->top = ci->top = base + fsize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      if (L == G(L)->mainthread && p->ravi_jit.jit_status == RAVI_JIT_NOT_COMPILED) {
        /* not compiled */
        ravi_compile_options_t options;
        memset(&options, 0, sizeof options);
        raviV_compile(L, p, &options);
      }
      if (L == G(L)->mainthread && p->ravi_jit.jit_function) {
        /* compiled */
        ci->jitstatus = 1;
        /* Since the JITed function does not update savedpc
         * other than for calls by default - the stack trace error
         * message below will be unable to find the line info
         * as savedpc is not set correctly - so we set this here
         * prior to the call
         */
        ci->u.l.savedpc++;
        /* As JITed function is like a C function
         * employ the same restrictions on recursive
         * calls as for C functions
         */
        if (++L->nCcalls >= LUAI_MAXCCALLS) {
          if (L->nCcalls == LUAI_MAXCCALLS)
            luaG_runerror(L, "stack overflow");
          else if (L->nCcalls >= (LUAI_MAXCCALLS + (LUAI_MAXCCALLS >> 3)))
            luaD_throw(L, LUA_ERRERR); /* error while handing stack error */
        }
        /* Disable YIELDs - so JITed functions cannot
         * yield
         */
        L->nny++;
        int b = (*p->ravi_jit.jit_function)(L);
        L->nny--;
        L->nCcalls--;
        if (op_call && b) {
          lua_assert(isLua(L->ci));
          /* b is the value returned by luaD_poscall()
           */
          L->top = L->ci->top;
        }
        /* Return a different value from 1 to
         * allow luaV_execute() to distinguish between
         * JITed function and true C function
         */
        return 2;
      }
      return 0;
    }
    case RAVI_TFCF: {
      int nargs = (int)(L->top - func - 1);
      int tt = rttype(func);
      int sig = getfcf_tag(tt); /* Extract the function signature */
      switch (sig) {
        case RAVI_TFCF_LOG:
        case RAVI_TFCF_EXP:
        case RAVI_TFCF_D_D: {
          if (nargs == 1) {
            TValue *arg1 = func + 1;
            double arg;
            if (ttisfloat(arg1))
              arg = fltvalue(arg1);
            else if (ttisinteger(arg1))
              arg = (double)ivalue(arg1);
            else
              nargs = 0;
            if (nargs) {
              double v;
              switch (sig) {
                case RAVI_TFCF_EXP: v = exp(arg); break;
                case RAVI_TFCF_LOG: v = log(arg); break;
                default: {
                  double(*f)(double) = fcfvalue(func);
                  v = f(arg);
                  break;
                }
              }
              setfltvalue(func, v);
              L->top = func + 1; /* top points after the last result */
              return 1;
            }
          }
          break;
        }
        default: { break; }
      }
      luaG_runerror(L, "Unsupported fastcall to C function");
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* ensure space for metamethod */
      tryfuncTM(L, func);  /* try to get '__call' metamethod */
      return luaD_precall(L, func, nresults, op_call);  /* now it must be a function */
    }
  }
}